

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

void AlphaVectorPlanning::ExportPOMDPFile(string *filename,DecPOMDPDiscreteInterface *decpomdp)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  void *pvVar5;
  long *plVar6;
  long *in_RSI;
  string *in_RDI;
  double dVar7;
  int s0_2;
  int a_3;
  int s1_1;
  int o_1;
  int a_2;
  int s1;
  int s0_1;
  int a_1;
  double p;
  double bs;
  int s0;
  StateDistribution *isd;
  string obs;
  int o;
  string action;
  int a;
  string state;
  int s;
  ofstream fp;
  int nrS;
  int nrO;
  int nrA;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa58;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3cc;
  undefined8 local_3b0;
  undefined8 local_388;
  string local_380 [32];
  string local_360 [36];
  int local_33c;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined1 local_319;
  undefined8 local_318;
  undefined8 local_310;
  char *local_308;
  undefined8 local_300;
  string local_2f8 [32];
  string local_2d8 [36];
  int local_2b4;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined1 local_291;
  undefined8 local_290;
  undefined8 local_288;
  char *local_280;
  undefined8 local_278;
  string local_270 [32];
  string local_250 [32];
  int local_230;
  long local_220 [64];
  int local_1c;
  int local_18;
  int local_14;
  long *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = (**(code **)(*(long *)((long)in_RSI + *(long *)(*in_RSI + -0xb8)) + 0x68))
                       ((long)in_RSI + *(long *)(*in_RSI + -0xb8));
  local_18 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 200))
                       ((long)local_10 + *(long *)(*local_10 + -0xb8));
  local_1c = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x30))
                       ((long)local_10 + *(long *)(*local_10 + -0xb8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_220,pcVar3,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "AlphaVectorPOMDP::ExportPOMDPFile: failed to open file ");
    poVar4 = std::operator<<(poVar4,local_8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)local_220,"discount: ");
  dVar7 = (double)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x70))
                            ((long)local_10 + *(long *)(*local_10 + -0xb0));
  pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar7);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  iVar2 = (**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb0)) + 0x80))
                    ((long)local_10 + *(long *)(*local_10 + -0xb0));
  if (iVar2 == 0) {
    poVar4 = std::operator<<((ostream *)local_220,"values: reward");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else if (iVar2 == 1) {
    poVar4 = std::operator<<((ostream *)local_220,"values: cost");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)local_220,"states:");
  for (local_230 = 0; local_230 < local_1c; local_230 = local_230 + 1) {
    plVar6 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x38))
                               ((long)local_10 + *(long *)(*local_10 + -0xb8),local_230);
    (**(code **)(*plVar6 + 0x18))(local_270);
    std::operator+(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
    std::__cxx11::string::~string(local_270);
    local_288 = std::__cxx11::string::begin();
    local_290 = std::__cxx11::string::end();
    local_291 = 0x5f;
    local_280 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                  (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                                   in_stack_fffffffffffffa48);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    local_2a8 = std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    local_2b0 = std::__cxx11::string::erase(local_250,local_278,local_2a0);
    poVar4 = std::operator<<((ostream *)local_220," ");
    std::operator<<(poVar4,local_250);
    std::__cxx11::string::~string(local_250);
  }
  std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_220,"actions:");
  for (local_2b4 = 0; local_2b4 < local_14; local_2b4 = local_2b4 + 1) {
    plVar6 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x80))
                               ((long)local_10 + *(long *)(*local_10 + -0xb8),local_2b4);
    (**(code **)(*plVar6 + 0x20))(local_2f8);
    std::operator+(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
    std::__cxx11::string::~string(local_2f8);
    local_310 = std::__cxx11::string::begin();
    local_318 = std::__cxx11::string::end();
    local_319 = 0x5f;
    local_308 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                  (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                                   in_stack_fffffffffffffa48);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    local_330 = std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    local_338 = std::__cxx11::string::erase(local_2d8,local_300,local_328);
    poVar4 = std::operator<<((ostream *)local_220," ");
    std::operator<<(poVar4,local_2d8);
    std::__cxx11::string::~string(local_2d8);
  }
  std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_220,"observations:");
  for (local_33c = 0; local_33c < local_18; local_33c = local_33c + 1) {
    plVar6 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0xd8))
                               ((long)local_10 + *(long *)(*local_10 + -0xb8),local_33c);
    (**(code **)(*plVar6 + 0x20))(local_380);
    std::operator+(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    std::__cxx11::string::erase(local_360,local_388,local_3b0);
    poVar4 = std::operator<<((ostream *)local_220," ");
    std::operator<<(poVar4,local_360);
    std::__cxx11::string::~string(local_360);
  }
  std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  plVar6 = (long *)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) + 0x50))
                             ((long)local_10 + *(long *)(*local_10 + -0xb8));
  std::operator<<((ostream *)local_220,"start: ");
  for (local_3cc = 0; local_3cc < local_1c; local_3cc = local_3cc + 1) {
    dVar7 = (double)(**(code **)(*plVar6 + 0x10))(plVar6,local_3cc);
    poVar4 = (ostream *)std::ostream::operator<<(local_220,dVar7);
    std::operator<<(poVar4," ");
  }
  std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))();
  }
  for (local_3e4 = 0; local_3e4 < local_14; local_3e4 = local_3e4 + 1) {
    for (local_3e8 = 0; local_3e8 < local_1c; local_3e8 = local_3e8 + 1) {
      for (local_3ec = 0; local_3ec < local_1c; local_3ec = local_3ec + 1) {
        dVar7 = (double)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) +
                                    0x108))((long)local_10 + *(long *)(*local_10 + -0xb8),local_3e8,
                                            local_3e4,local_3ec);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          poVar4 = std::operator<<((ostream *)local_220,"T: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3e4);
          poVar4 = std::operator<<(poVar4," : ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3e8);
          poVar4 = std::operator<<(poVar4," : ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3ec);
          poVar4 = std::operator<<(poVar4," ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar7);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  for (local_3f0 = 0; local_3f0 < local_14; local_3f0 = local_3f0 + 1) {
    for (local_3f4 = 0; local_3f4 < local_18; local_3f4 = local_3f4 + 1) {
      for (local_3f8 = 0; local_3f8 < local_1c; local_3f8 = local_3f8 + 1) {
        dVar7 = (double)(**(code **)(*(long *)((long)local_10 + *(long *)(*local_10 + -0xb8)) +
                                    0x118))((long)local_10 + *(long *)(*local_10 + -0xb8),local_3f0,
                                            local_3f8,local_3f4);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          poVar4 = std::operator<<((ostream *)local_220,"O: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3f0);
          poVar4 = std::operator<<(poVar4," : ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3f8);
          poVar4 = std::operator<<(poVar4," : ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3f4);
          poVar4 = std::operator<<(poVar4," ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar7);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  for (local_3fc = 0; local_3fc < local_14; local_3fc = local_3fc + 1) {
    for (local_400 = 0; local_400 < local_1c; local_400 = local_400 + 1) {
      dVar7 = (double)(**(code **)(*local_10 + 0xc0))(local_10,local_400,local_3fc);
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        poVar4 = std::operator<<((ostream *)local_220,"R: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3fc);
        poVar4 = std::operator<<(poVar4," : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_400);
        poVar4 = std::operator<<(poVar4," : * : * ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,dVar7);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void AlphaVectorPlanning::ExportPOMDPFile(const string & filename,
                                          const DecPOMDPDiscreteInterface *decpomdp)
{
    int nrA=decpomdp->GetNrJointActions(),
        nrO=decpomdp->GetNrJointObservations(),
        nrS=decpomdp->GetNrStates();
    ofstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPOMDP::ExportPOMDPFile: failed to open file "
             << filename << endl;            
    }

    fp << "discount: " << decpomdp->GetDiscount() << endl;
    switch(decpomdp->GetRewardType())
    {
    case REWARD:
        fp << "values: reward" << endl;
        break;
    case COST:
        fp << "values: cost" << endl;
    }

    // Tony's parser chokes on "_" in names of
    // states/actions/observations, so we just remove them from the
    // strings.
    // Also, we have to ensure that strings don't start with a number,
    // which we solve by prepending each string with s/a/o.
    fp << "states:";
    for(int s=0;s<nrS;s++)
    {
        string state="s" + decpomdp->GetState(s)->SoftPrintBrief();
        state.erase(remove(state.begin(), state.end(), '_'),state.end());
        fp << " "  << state;
    }
    fp << endl;

    fp << "actions:";
    for(int a=0;a<nrA;a++)
    {
        string action="a" + decpomdp->GetJointAction(a)->SoftPrintBrief();
        action.erase(remove(action.begin(), action.end(), '_'),action.end());
        fp << " "  << action;
    }
    fp << endl;

    fp << "observations:";
    for(int o=0;o<nrO;o++)
    {
        string obs="o" + decpomdp->GetJointObservation(o)->SoftPrintBrief();
        obs.erase(remove(obs.begin(), obs.end(), '_'),obs.end());
        fp << " "  << obs;
    }
    fp << endl;


    StateDistribution* isd = decpomdp->GetISD();
    fp << "start: ";
    for(int s0=0;s0<nrS;s0++)
    {
        double bs = isd->GetProbability(s0);
        fp <<  bs << " ";
    }
    fp << endl;

    delete isd;

    double p;
    for(int a=0;a<nrA;a++)
        for(int s0=0;s0<nrS;s0++)
            for(int s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetTransitionProbability(s0,a,s1);
                if(p!=0)
                    fp << "T: " << a << " : " << s0 << " : " << s1 << " " 
                       << p << endl;
            }

    for(int a=0;a<nrA;a++)
        for(int o=0;o<nrO;o++)
            for(int s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetObservationProbability(a,s1,o);
                if(p!=0)
                    fp << "O: " << a << " : " << s1 << " : " << o << " " 
                       << p << endl;
            }

    for(int a=0;a<nrA;a++)
        for(int s0=0;s0<nrS;s0++)
        {
            p=decpomdp->GetReward(s0,a);
            if(p!=0)
                fp << "R: " << a << " : " << s0 << " : * : * "
                   << p << endl;
        }

}